

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O1

idx_t __thiscall duckdb::LocalStorage::AddedRows(LocalStorage *this,DataTable *table)

{
  RowGroupCollection *this_00;
  idx_t iVar1;
  optional_ptr<duckdb::LocalTableStorage,_true> storage;
  optional_ptr<duckdb::LocalTableStorage,_true> local_18;
  
  local_18 = LocalTableManager::GetStorage(&this->table_manager,table);
  if (local_18.ptr == (LocalTableStorage *)0x0) {
    iVar1 = 0;
  }
  else {
    optional_ptr<duckdb::LocalTableStorage,_true>::CheckValid(&local_18);
    this_00 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&(local_18.ptr)->row_groups);
    iVar1 = RowGroupCollection::GetTotalRows(this_00);
    optional_ptr<duckdb::LocalTableStorage,_true>::CheckValid(&local_18);
    iVar1 = iVar1 - (local_18.ptr)->deleted_rows;
  }
  return iVar1;
}

Assistant:

idx_t LocalStorage::AddedRows(DataTable &table) {
	auto storage = table_manager.GetStorage(table);
	if (!storage) {
		return 0;
	}
	return storage->row_groups->GetTotalRows() - storage->deleted_rows;
}